

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::GenerateState(MergeReturnPass *this,BasicBlock *block)

{
  Op OVar1;
  reference pvVar2;
  Instruction *local_38;
  Instruction *lastMergeInst_1;
  Instruction *lastMergeInst;
  Instruction *branchInst;
  Instruction *mergeInst;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  mergeInst = (Instruction *)block;
  block_local = (BasicBlock *)this;
  branchInst = BasicBlock::GetMergeInst(block);
  if (branchInst != (Instruction *)0x0) {
    OVar1 = Instruction::opcode(branchInst);
    if (OVar1 == OpLoopMerge) {
      std::
      vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
      ::emplace_back<spvtools::opt::Instruction*&,spvtools::opt::Instruction*&>
                ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                  *)&this->state_,&branchInst,&branchInst);
    }
    else {
      lastMergeInst =
           utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                     (&branchInst->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      OVar1 = Instruction::opcode(lastMergeInst);
      if (OVar1 == OpSwitch) {
        pvVar2 = std::
                 vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                 ::back(&this->state_);
        lastMergeInst_1 = StructuredControlState::BreakMergeInst(pvVar2);
        if ((lastMergeInst_1 == (Instruction *)0x0) ||
           (OVar1 = Instruction::opcode(lastMergeInst_1), OVar1 != OpLoopMerge)) {
          std::
          vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
          ::emplace_back<spvtools::opt::Instruction*&,spvtools::opt::Instruction*&>
                    ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                      *)&this->state_,&branchInst,&branchInst);
        }
        else {
          std::
          vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
          ::emplace_back<spvtools::opt::Instruction*&,spvtools::opt::Instruction*&>
                    ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                      *)&this->state_,&lastMergeInst_1,&branchInst);
        }
      }
      else {
        pvVar2 = std::
                 vector<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                 ::back(&this->state_);
        local_38 = StructuredControlState::BreakMergeInst(pvVar2);
        std::
        vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
        ::emplace_back<spvtools::opt::Instruction*&,spvtools::opt::Instruction*&>
                  ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                    *)&this->state_,&local_38,&branchInst);
      }
    }
  }
  return;
}

Assistant:

void MergeReturnPass::GenerateState(BasicBlock* block) {
  if (Instruction* mergeInst = block->GetMergeInst()) {
    if (mergeInst->opcode() == spv::Op::OpLoopMerge) {
      // If new loop, break to this loop merge block
      state_.emplace_back(mergeInst, mergeInst);
    } else {
      auto branchInst = mergeInst->NextNode();
      if (branchInst->opcode() == spv::Op::OpSwitch) {
        // If switch inside of loop, break to innermost loop merge block.
        // Otherwise need to break to this switch merge block.
        auto lastMergeInst = state_.back().BreakMergeInst();
        if (lastMergeInst && lastMergeInst->opcode() == spv::Op::OpLoopMerge)
          state_.emplace_back(lastMergeInst, mergeInst);
        else
          state_.emplace_back(mergeInst, mergeInst);
      } else {
        // If branch conditional inside loop, always break to innermost
        // loop merge block. If branch conditional inside switch, break to
        // innermost switch merge block.
        auto lastMergeInst = state_.back().BreakMergeInst();
        state_.emplace_back(lastMergeInst, mergeInst);
      }
    }
  }
}